

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_endian.h
# Opt level: O1

wchar_t read_eocd(zip *zip,char *p,int64_t current_offset)

{
  if ((((*(short *)(p + 4) == 0) && (*(short *)(p + 6) == 0)) &&
      (*(short *)(p + 10) == *(short *)(p + 8))) &&
     ((long)(ulong)(*(int *)(p + 0xc) + *(uint *)(p + 0x10)) <= current_offset)) {
    zip->central_directory_offset = (ulong)*(uint *)(p + 0x10);
    return L' ';
  }
  return L'\0';
}

Assistant:

static inline uint16_t
archive_le16dec(const void *pp)
{
	unsigned char const *p = (unsigned char const *)pp;

	/* Store into unsigned temporaries before left shifting, to avoid
	promotion to signed int and then left shifting into the sign bit,
	which is undefined behaviour. */
	unsigned int p1 = p[1];
	unsigned int p0 = p[0];

	return ((p1 << 8) | p0);
}